

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS
ref_subdiv_node_between(REF_SUBDIV ref_subdiv,REF_INT node0,REF_INT node1,REF_INT *new_node)

{
  int local_2c;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT edge;
  REF_INT *new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_SUBDIV ref_subdiv_local;
  
  *new_node = -1;
  _ref_private_macro_code_rss = new_node;
  new_node_local._0_4_ = node1;
  new_node_local._4_4_ = node0;
  _node1_local = ref_subdiv;
  ref_subdiv_local._4_4_ = ref_edge_with(ref_subdiv->edge,node0,node1,&local_2c);
  if (ref_subdiv_local._4_4_ == 0) {
    *_ref_private_macro_code_rss = _node1_local->node[local_2c];
    ref_subdiv_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x130,
           "ref_subdiv_node_between",(ulong)ref_subdiv_local._4_4_,"missing edge");
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_node_between(REF_SUBDIV ref_subdiv,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_INT *new_node) {
  REF_INT edge;

  (*new_node) = REF_EMPTY;

  RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), node0, node1, &edge),
      "missing edge");

  (*new_node) = ref_subdiv_node(ref_subdiv, edge);

  return REF_SUCCESS;
}